

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O2

void __thiscall
pstore::region::factory::append<pstore::file::in_memory,pstore::in_memory_mapper>
          (factory *this,shared_ptr<pstore::file::in_memory> *file,
          not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
          regions,uint64_t original_size,uint64_t new_size)

{
  uint64_t minimum_size;
  ulong __length;
  ulong uVar1;
  char *__file;
  region_builder<pstore::file::in_memory,_pstore::in_memory_mapper> builder;
  __shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2> local_60;
  region_builder<pstore::file::in_memory,_pstore::in_memory_mapper> local_50;
  
  if (original_size <= new_size) {
    minimum_size = this->min_size_;
    std::__shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,
               &file->super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>);
    region_builder<pstore::file::in_memory,_pstore::in_memory_mapper>::region_builder
              (&local_50,(shared_ptr<pstore::file::in_memory> *)&local_60,this->full_size_,
               minimum_size);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    uVar1 = (new_size + minimum_size) - 1;
    __length = uVar1 % minimum_size;
    __file = (char *)(uVar1 - __length);
    pstore::file::in_memory::truncate
              ((file->super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr,__file,__length);
    region_builder<pstore::file::in_memory,_pstore::in_memory_mapper>::append
              (&local_50,regions,original_size,(long)__file - original_size);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_50.file_.
                super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    return;
  }
  assert_failed("new_size >= original_size",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/region.hpp"
                ,0x111);
}

Assistant:

void factory::append (std::shared_ptr<File> file,
                              gsl::not_null<std::vector<memory_mapper_ptr> *> regions,
                              std::uint64_t original_size, std::uint64_t new_size) {

            PSTORE_ASSERT (new_size >= original_size);

            auto const min_size = this->min_size ();
            region_builder<File, MemoryMapper> builder (file, this->full_size (), min_size);

            new_size = round_up (new_size, min_size);
            if (!small_files_enabled ()) {
                file->truncate (new_size);
            }
            builder.append (regions, original_size, new_size - original_size);
        }